

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl_init.hpp
# Opt level: O0

void __thiscall asio::ssl::detail::openssl_init<true>::openssl_init(openssl_init<true> *this)

{
  openssl_init<true> *tmp;
  openssl_init<true> *this_local;
  
  openssl_init_base::openssl_init_base((openssl_init_base *)this);
  openssl_init_base::instance();
  return;
}

Assistant:

openssl_init()
    : ref_(instance())
  {
    using namespace std; // For memmove.

    // Ensure openssl_init::instance_ is linked in.
    openssl_init* tmp = &instance_;
    memmove(&tmp, &tmp, sizeof(openssl_init*));
  }